

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O1

Statement *
slang::ast::ProceduralCheckerStatement::fromSyntax
          (Compilation *comp,CheckerInstanceStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  CheckerInstantiationSyntax *pCVar1;
  Scope *this;
  Compilation *this_00;
  int iVar2;
  ProceduralBlockSymbol *pPVar3;
  Statement *pSVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  Symbol *pSVar6;
  undefined4 extraout_var;
  ProceduralCheckerStatement *pPVar7;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  ulong uVar8;
  DiagCode code;
  ulong uVar9;
  SourceRange sourceRange;
  string_view name;
  Symbol *sym;
  SmallVector<const_slang::ast::Symbol_*,_5UL> instances;
  span<const_slang::ast::Symbol_*,_18446744073709551615UL> local_98;
  Compilation *local_88;
  SmallVectorBase<const_slang::ast::Symbol_*> local_80 [2];
  SourceRange local_40;
  
  pPVar3 = ASTContext::getProceduralBlock(context);
  if ((pPVar3 == (ProceduralBlockSymbol *)0x0) || (pPVar3->procedureKind == Final)) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    code.subsystem = Statements;
    code.code = 10;
  }
  else {
    if (((stmtCtx->flags).m_bits & 2) == 0) {
      local_80[0].data_ = (pointer)local_80[0].firstElement;
      local_80[0].len = 0;
      local_80[0].cap = 5;
      pCVar1 = (syntax->instance).ptr;
      uVar9 = (pCVar1->instances).elements._M_extent._M_extent_value + 1;
      src = extraout_RDX;
      local_88 = comp;
      if (1 < uVar9) {
        uVar8 = 0;
        do {
          ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                              ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                               ((pCVar1->instances).elements._M_ptr + uVar8 * 2));
          src = extraout_RDX_00;
          if (*(long *)(*ppSVar5 + 1) != 0) {
            this = (context->scope).ptr;
            name = parsing::Token::valueText((Token *)(*(long *)(*ppSVar5 + 1) + 0x18));
            local_98._M_ptr = (pointer)Scope::find(this,name);
            pSVar6 = (Symbol *)local_98._M_ptr;
            src = extraout_RDX_01;
            if ((Symbol *)local_98._M_ptr != (Symbol *)0x0) {
              for (; (pSVar6->kind == InstanceArray && (*(long *)(pSVar6 + 2) != 0));
                  pSVar6 = *(Symbol **)pSVar6[1].originatingSyntax) {
              }
              if (pSVar6->kind == CheckerInstance) {
                SmallVectorBase<slang::ast::Symbol_const*>::
                emplace_back<slang::ast::Symbol_const*const&>
                          ((SmallVectorBase<slang::ast::Symbol_const*> *)local_80,
                           (Symbol **)&local_98);
                src = extraout_RDX_02;
              }
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar9 >> 1);
      }
      this_00 = local_88;
      iVar2 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                        (local_80,(EVP_PKEY_CTX *)local_88,src);
      local_98._M_ptr = (pointer)CONCAT44(extraout_var,iVar2);
      local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pPVar7 = BumpAllocator::
               emplace<slang::ast::ProceduralCheckerStatement,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::SourceRange>
                         (&this_00->super_BumpAllocator,&local_98,&local_40);
      if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
        operator_delete(local_80[0].data_);
      }
      return &pPVar7->super_Statement;
    }
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    code.subsystem = Statements;
    code.code = 9;
  }
  ASTContext::addDiag(context,code,sourceRange);
  pSVar4 = Statement::badStmt(comp,(Statement *)0x0);
  return pSVar4;
}

Assistant:

Statement& ProceduralCheckerStatement::fromSyntax(Compilation& comp,
                                                  const CheckerInstanceStatementSyntax& syntax,
                                                  const ASTContext& context,
                                                  StatementContext& stmtCtx) {
    auto proc = context.getProceduralBlock();
    if (!proc || proc->procedureKind == ProceduralBlockKind::Final) {
        context.addDiag(diag::CheckerNotInProc, syntax.sourceRange());
        return badStmt(comp, nullptr);
    }

    if (stmtCtx.flags.has(StatementFlags::InForkJoin)) {
        context.addDiag(diag::CheckerInForkJoin, syntax.sourceRange());
        return badStmt(comp, nullptr);
    }

    // Find all of the checkers that were pre-created for this syntax node.
    // It's possible to not find them if there were errors in the declaration,
    // so we don't issue errors here -- they are already handled.
    SmallVector<const Symbol*> instances;
    for (auto instSyntax : syntax.instance->instances) {
        if (auto decl = instSyntax->decl) {
            if (auto sym = context.scope->find(decl->name.valueText())) {
                auto nestedSym = sym;
                while (nestedSym->kind == SymbolKind::InstanceArray) {
                    auto& array = nestedSym->as<InstanceArraySymbol>();
                    if (array.elements.empty())
                        break;

                    nestedSym = array.elements[0];
                }

                if (nestedSym->kind == SymbolKind::CheckerInstance)
                    instances.push_back(sym);
            }
        }
    }

    return *comp.emplace<ProceduralCheckerStatement>(instances.copy(comp), syntax.sourceRange());
}